

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O1

void __thiscall helics::MessageFederate::MessageFederate(MessageFederate *this,char *configString)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,configString,&local_31);
  MessageFederate(this,(string_view)ZEXT816(0),&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

MessageFederate::MessageFederate(const char* configString):
    MessageFederate(std::string_view{}, std::string{configString})
{
}